

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_source_interpolation_with_magic_number.cc
# Opt level: O3

bool __thiscall
sptk::InputSourceInterpolationWithMagicNumber::Get
          (InputSourceInterpolationWithMagicNumber *this,
          vector<double,_std::allocator<double>_> *buffer)

{
  int iVar1;
  pointer pdVar2;
  pointer pdVar3;
  int iVar4;
  size_t sVar5;
  bool bVar6;
  long lVar7;
  double dVar8;
  
  if (((buffer == (vector<double,_std::allocator<double>_> *)0x0) || (this->is_valid_ != true)) ||
     (this->remained_num_samples_ < 1)) {
    bVar6 = false;
  }
  else {
    if ((long)(buffer->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(buffer->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != (long)this->data_length_) {
      std::vector<double,_std::allocator<double>_>::resize(buffer,(long)this->data_length_);
    }
    pdVar2 = (this->curr_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar5 = (long)(this->curr_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar2;
    if (sVar5 != 0) {
      memmove((buffer->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start,pdVar2,sVar5);
    }
    iVar4 = this->remained_num_samples_;
    this->remained_num_samples_ = iVar4 + -1;
    if (iVar4 < 2) {
      bVar6 = true;
      if (this->use_final_frame_for_exceeded_frame_ == true) {
        this->remained_num_samples_ = 1;
      }
    }
    else {
      iVar4 = this->point_index_in_frame_ + 1;
      this->point_index_in_frame_ = iVar4;
      if (iVar4 % this->frame_period_ == 0) {
        pdVar2 = (this->next_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar5 = (long)(this->next_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_finish - (long)pdVar2;
        if (sVar5 != 0) {
          memmove((this->curr_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,pdVar2,sVar5);
        }
        iVar4 = (*this->source_->_vptr_InputSourceInterface[4])(this->source_,&this->next_data_);
        if ((char)iVar4 == '\0') {
          pdVar2 = (this->curr_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar4 = 1;
          sVar5 = (long)(this->curr_data_).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2;
          if (sVar5 != 0) {
            memmove((this->next_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,pdVar2,sVar5);
          }
        }
        else {
          iVar4 = this->frame_period_ + 1;
        }
        this->remained_num_samples_ = iVar4;
        if (0 < this->interpolation_period_) {
          CalculateIncrement(this);
        }
        this->point_index_in_frame_ = 0;
        bVar6 = true;
      }
      else {
        iVar1 = this->interpolation_period_;
        if (iVar1 < 1) {
          bVar6 = true;
          if (this->frame_period_ / 2 == iVar4 && iVar1 == 0) {
            pdVar2 = (this->next_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            sVar5 = (long)(this->next_data_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2;
            if (sVar5 != 0) {
              memmove((this->curr_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_start,pdVar2,sVar5);
            }
          }
        }
        else {
          bVar6 = true;
          if (((iVar4 + this->first_interpolation_period_) % iVar1 == 0) &&
             (iVar4 = this->data_length_, 0 < (long)iVar4)) {
            pdVar2 = (this->curr_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar3 = (this->increment_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar7 = 0;
            do {
              dVar8 = pdVar3[lVar7];
              if ((dVar8 != 1.79769313486232e+308) || (NAN(dVar8))) {
                dVar8 = dVar8 + pdVar2[lVar7];
              }
              else {
                dVar8 = this->magic_number_;
              }
              pdVar2[lVar7] = dVar8;
              lVar7 = lVar7 + 1;
            } while (iVar4 != lVar7);
          }
        }
      }
    }
  }
  return bVar6;
}

Assistant:

bool InputSourceInterpolationWithMagicNumber::Get(std::vector<double>* buffer) {
  if (NULL == buffer || !is_valid_) {
    return false;
  }

  if (remained_num_samples_ <= 0) {
    return false;
  }

  if (buffer->size() != static_cast<std::size_t>(data_length_)) {
    buffer->resize(data_length_);
  }

  std::copy(curr_data_.begin(), curr_data_.end(), buffer->begin());

  --remained_num_samples_;

  if (remained_num_samples_ <= 0) {
    if (use_final_frame_for_exceeded_frame_) {
      remained_num_samples_ = 1;
    }
    return true;
  }

  // Update internal states for the next call.
  ++point_index_in_frame_;

  if (0 == point_index_in_frame_ % frame_period_) {
    // Update current and next data.
    std::copy(next_data_.begin(), next_data_.end(), curr_data_.begin());
    if (!source_->Get(&next_data_)) {
      // Use the final data until the end of input sequence.
      std::copy(curr_data_.begin(), curr_data_.end(), next_data_.begin());
      remained_num_samples_ = 1;
    } else {
      remained_num_samples_ = frame_period_ + 1;
    }

    if (0 < interpolation_period_) {
      CalculateIncrement();
    }

    // Rewind point index.
    point_index_in_frame_ = 0;
  } else if (0 < interpolation_period_ &&
             0 == ((point_index_in_frame_ + first_interpolation_period_) %
                   interpolation_period_)) {
    // Interpolate adjacent data without magic number.
    for (int i(0); i < data_length_; ++i) {
      if (kCannotCalculateIncrements == increment_[i]) {
        curr_data_[i] = magic_number_;
      } else {
        curr_data_[i] += increment_[i];
      }
    }
  } else if (0 == interpolation_period_ &&
             frame_period_ / 2 == point_index_in_frame_) {
    std::copy(next_data_.begin(), next_data_.end(), curr_data_.begin());
  }

  return true;
}